

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O2

bool __thiscall
SGParser::Generator::RegExprNFAParseHandler::Reduce
          (RegExprNFAParseHandler *this,Parse<SGParser::Generator::RegExprNFAParseElement> *parse,
          uint productionID)

{
  pointer puVar1;
  anon_union_8_3_bb83494e_for_RegExprNFAParseElement_3 aVar2;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
  *this_00;
  undefined4 uVar3;
  pointer puVar4;
  RegExprNFAParseElement *pRVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar6;
  NFA *pNVar7;
  const_iterator cVar8;
  NFA *this_01;
  _Base_ptr p_Var9;
  RegExprDataType RVar10;
  uint *ord;
  KleeneType type;
  ulong uVar11;
  anon_union_8_3_bb83494e_for_RegExprNFAParseElement_3 *__x;
  bool bVar12;
  uint uVar13;
  IndexType IVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  anon_union_8_3_bb83494e_for_RegExprNFAParseElement_3 local_80;
  string names;
  anon_union_8_3_bb83494e_for_RegExprNFAParseElement_3 aStack_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> charList;
  
  bVar12 = true;
  switch(productionID) {
  case 1:
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
    pNVar7 = (pRVar5->field_1).pNFA;
    IVar14 = 1;
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,1);
    NFA::Concat(pNVar7,(pRVar5->field_1).pNFA);
    goto LAB_0013522f;
  case 2:
  case 4:
  case 8:
    break;
  case 3:
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
    pNVar7 = (pRVar5->field_1).pNFA;
    IVar14 = 2;
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,2);
    NFA::Or(pNVar7,(pRVar5->field_1).pNFA);
LAB_0013522f:
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,IVar14);
    RegExprNFAParseElement::Destroy(pRVar5);
    break;
  case 5:
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
    pNVar7 = (pRVar5->field_1).pNFA;
    type = ConnectBoth;
    goto LAB_0013519d;
  case 6:
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
    pNVar7 = (pRVar5->field_1).pNFA;
    type = ConnectBack;
    goto LAB_0013519d;
  case 7:
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
    pNVar7 = (pRVar5->field_1).pNFA;
    type = ConnectEmpty;
LAB_0013519d:
    NFA::Kleene(pNVar7,type);
    break;
  case 9:
    IVar14 = 1;
    goto LAB_001352a2;
  case 10:
    pNVar7 = (NFA *)operator_new(0x28);
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
    NFA::NFA(pNVar7,(pRVar5->field_1).ch,this->LexemeID);
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
    (pRVar5->field_1).pNFA = pNVar7;
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
    pRVar5->DataType = NFA;
    break;
  case 0xb:
    aStack_58.pNFA = (NFA *)0x0;
    charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&aStack_58,0xfd);
    uVar3 = 1;
    while( true ) {
      local_80.ch = uVar3;
      if (0xff < (uint)uVar3) break;
      if (((char)uVar3 != '\n') && ((uVar3 & 0xff) != 0xd)) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&aStack_58,&local_80.ch);
        uVar3 = local_80.ch;
      }
      uVar3 = uVar3 + 1;
    }
    pNVar7 = (NFA *)operator_new(0x28);
    NFA::NFA(pNVar7,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&aStack_58,this->LexemeID
            );
    goto LAB_00135597;
  case 0xc:
    names.field_2._8_8_ = parse;
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,1);
    pvVar6 = (pRVar5->field_1).pVec;
    charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    aStack_58.pNFA = (NFA *)0x0;
    charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    puVar4 = (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    for (uVar11 = 0;
        parse = (Parse<SGParser::Generator::RegExprNFAParseElement> *)names.field_2._8_8_,
        uVar11 < (ulong)((long)(pvVar6->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 2);
        uVar11 = uVar11 + 2) {
      uVar13 = puVar4[uVar11];
      while( true ) {
        local_80.ch = uVar13;
        if (puVar4[uVar11 | 1] < uVar13) break;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&aStack_58,&local_80.ch);
        uVar13 = local_80.ch + 1;
        puVar4 = (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
    }
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[]
                       ((Parse<SGParser::Generator::RegExprNFAParseElement> *)names.field_2._8_8_,1)
    ;
    RegExprNFAParseElement::Destroy(pRVar5);
    pNVar7 = (NFA *)operator_new(0x28);
    NFA::NFA(pNVar7,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&aStack_58,this->LexemeID
            );
    goto LAB_00135597;
  case 0xd:
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,2);
    pvVar6 = (pRVar5->field_1).pVec;
    charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    aStack_58.pNFA = (NFA *)0x0;
    charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    uVar3 = 1;
    while( true ) {
      local_80.ch = uVar3;
      if (0xff < (uint)uVar3) break;
      puVar4 = (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      bVar12 = false;
      for (uVar11 = 0;
          uVar11 < (ulong)((long)(pvVar6->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 2);
          uVar11 = uVar11 + 2) {
        for (uVar13 = puVar4[uVar11]; uVar13 <= puVar4[uVar11 + 1]; uVar13 = uVar13 + 1) {
          bVar12 = (bool)(bVar12 | uVar3 == uVar13);
        }
      }
      if (!bVar12) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&aStack_58,&local_80.ch);
        uVar3 = local_80.ch;
      }
      uVar3 = uVar3 + 1;
    }
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,2);
    RegExprNFAParseElement::Destroy(pRVar5);
    pNVar7 = (NFA *)operator_new(0x28);
    NFA::NFA(pNVar7,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&aStack_58,this->LexemeID
            );
LAB_00135597:
    bVar12 = true;
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
    (pRVar5->field_1).pNFA = pNVar7;
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
    pRVar5->DataType = NFA;
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&aStack_58);
    break;
  case 0xe:
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,1);
    if ((pRVar5->field_1).pNFA == (NFA *)0x0) {
      __assert_fail("parse[1].pVec",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Lex.cpp"
                    ,0xe0,
                    "virtual bool SGParser::Generator::RegExprNFAParseHandler::Reduce(Parse<RegExprNFAParseElement> &, unsigned int)"
                   );
    }
    aStack_58.pNFA =
         (NFA *)&charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)((ulong)charList.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
    Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,1);
    std::__cxx11::string::reserve((ulong)&aStack_58);
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,1);
    puVar1 = (((pRVar5->field_1).pVec)->
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (puVar4 = (((pRVar5->field_1).pVec)->
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                  super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
      std::__cxx11::string::push_back((char)&aStack_58);
    }
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,1);
    RegExprNFAParseElement::Destroy(pRVar5);
    this_00 = &this->pMacroNFAs->_M_t;
    if (this_00 ==
        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
         *)0x0) {
      __assert_fail("pMacroNFAs != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Lex.cpp"
                    ,0xeb,
                    "virtual bool SGParser::Generator::RegExprNFAParseHandler::Reduce(Parse<RegExprNFAParseElement> &, unsigned int)"
                   );
    }
    cVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
            ::find(this_00,(key_type *)&aStack_58);
    if ((_Rb_tree_header *)cVar8._M_node == &(this_00->_M_impl).super__Rb_tree_header) {
      local_80.pNFA = (NFA *)&names._M_string_length;
      names._M_dataplus._M_p = (pointer)0x0;
      names._M_string_length._0_1_ = 0;
      names.field_2._8_8_ = this_00;
      for (p_Var9 = (this_00->_M_impl).super__Rb_tree_header._M_header._M_left;
          p_Var9 != cVar8._M_node; p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
        std::operator+(&local_a0," \'",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var9 + 1));
        std::operator+(&local_c0,&local_a0,'\'');
        std::__cxx11::string::append((string *)&local_80);
        std::__cxx11::string::~string((string *)&local_c0);
        std::__cxx11::string::~string((string *)&local_a0);
      }
      Lex::CheckForErrorAndReport
                (this->pLex,"Macro \'%s\' not defined; there are %zu known macros:%s",aStack_58.pNFA
                 ,*(undefined8 *)(names.field_2._8_8_ + 0x28),local_80.pNFA);
      std::__cxx11::string::~string((string *)&local_80);
    }
    else {
      pNVar7 = *(NFA **)(cVar8._M_node + 2);
      if (pNVar7 != (NFA *)0x0) {
        this_01 = (NFA *)operator_new(0x28);
        NFA::NFA(this_01,pNVar7,this->LexemeID);
        pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
        (pRVar5->field_1).pNFA = this_01;
        pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
        pRVar5->DataType = NFA;
        std::__cxx11::string::~string((string *)&aStack_58);
        return true;
      }
      Lex::CheckForErrorAndReport
                (this->pLex,"Invalid regular expression in macro \'%s\' used",aStack_58.pNFA);
    }
    std::__cxx11::string::~string((string *)&aStack_58);
    bVar12 = false;
    break;
  case 0xf:
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
    __x = &aStack_58;
    aStack_58.ch = (pRVar5->field_1).ch;
    pvVar6 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x18);
    (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
    (pRVar5->field_1).pVec = pvVar6;
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
    pRVar5->DataType = Vector;
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
    pvVar6 = (pRVar5->field_1).pVec;
    goto LAB_0013544c;
  case 0x10:
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,1);
    pvVar6 = (pRVar5->field_1).pVec;
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (pvVar6,&(pRVar5->field_1).ch);
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,1);
    pvVar6 = (pRVar5->field_1).pVec;
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (pvVar6,&(pRVar5->field_1).ch);
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,1);
    aVar2 = pRVar5->field_1;
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
    pRVar5->field_1 = aVar2;
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,1);
    RVar10 = pRVar5->DataType;
    goto LAB_001352d0;
  case 0x11:
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
    aStack_58.ch = (pRVar5->field_1).ch;
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,2);
    __x = &local_80;
    local_80.ch = (pRVar5->field_1).ch;
    pvVar6 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x18);
    (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
    (pRVar5->field_1).pVec = pvVar6;
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
    pRVar5->DataType = Vector;
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
    pvVar6 = (pRVar5->field_1).pVec;
LAB_0013544c:
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pvVar6,&aStack_58.ch);
LAB_00135451:
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
    pvVar6 = (pRVar5->field_1).pVec;
LAB_00135462:
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(pvVar6,&__x->ch);
    break;
  case 0x12:
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
    aStack_58.ch = (pRVar5->field_1).ch;
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,2);
    local_80.ch = (pRVar5->field_1).ch;
    IVar14 = 3;
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,3);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((pRVar5->field_1).pVec,&aStack_58.ch);
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,3);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((pRVar5->field_1).pVec,&local_80.ch);
LAB_001352a2:
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,IVar14);
    aVar2 = pRVar5->field_1;
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
    pRVar5->field_1 = aVar2;
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,IVar14);
    RVar10 = pRVar5->DataType;
LAB_001352d0:
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
    pRVar5->DataType = RVar10;
    break;
  case 0x13:
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
    __x = &aStack_58;
    aStack_58.ch = (pRVar5->field_1).ch;
    pvVar6 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x18);
    (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
    (pRVar5->field_1).pVec = pvVar6;
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
    pRVar5->DataType = Vector;
    goto LAB_00135451;
  case 0x14:
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
    pvVar6 = (pRVar5->field_1).pVec;
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,1);
    __x = &pRVar5->field_1;
    goto LAB_00135462;
  default:
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
    (pRVar5->field_1).pNFA = (NFA *)0x0;
    pRVar5 = Parse<SGParser::Generator::RegExprNFAParseElement>::operator[](parse,0);
    pRVar5->DataType = Null;
  }
  return bVar12;
}

Assistant:

bool Reduce(Parse<RegExprNFAParseElement>& parse, unsigned productionID) override {
        switch (productionID) {
            // RegExp --> RegExp  A
            case RE_RegExpConcat:
                // Make a NFA from A and B. Put in parseStack
                parse[0].pNFA->Concat(*parse[1].pNFA);
                parse[1].Destroy();
                break;

                // RegExp --> A
            case RE_RegExp:
                break;

                // A --> A '|' B
            case RE_AOr:
                // Make a NFA from A and B. Put in parseStack
                parse[0].pNFA->Or(*parse[2].pNFA);
                parse[2].Destroy();
                break;

                // A --> B
            case RE_A:
                break;

                // B --> B '*'
            case RE_BStar:
                // Make a NFA from A*
                parse[0].pNFA->Kleene(NFA::KleeneType::ConnectBoth);
                break;

                // B --> B '+'
            case RE_BPlus:
                // Make a NFA from A+
                parse[0].pNFA->Kleene(NFA::KleeneType::ConnectBack);
                break;

                // B --> B '?'
            case RE_BQuestion:
                // Make a NFA for one optional character
                parse[0].pNFA->Kleene(NFA::KleeneType::ConnectEmpty);
                break;

                // B --> C
            case RE_B:
                break;

                // C --> '(' RegExp ')'
            case RE_CParen:
                parse[0].pNFA     = parse[1].pNFA;
                parse[0].DataType = parse[1].DataType;
                break;

                // C --> character
            case RE_CChar:
                // Make an NFA from the character. Assign to parseStack
                parse[0].pNFA     = new NFA{parse[0].ch, LexemeID};
                parse[0].DataType = RegExprNFAParseElement::RegExprDataType::NFA;
                break;

                // C --> '.'
            case RE_CDot: {
                // Construct a list of all characters but '\n'
                std::vector<unsigned> charList;
                charList.reserve(253u);
                for (unsigned k = 1u; k <= 255u; k++)
                    if (k != '\n' && k != '\r')
                        charList.push_back(k);

                // ...and then make the NFA
                parse[0].pNFA     = new NFA{charList, LexemeID};
                parse[0].DataType = RegExprNFAParseElement::RegExprDataType::NFA;
                break;
            }

                // C --> '[' GroupSet ']'
            case RE_CGroupSet: {
                // Make a NFA out of the sequence
                const auto pgroupSet = parse[1].pVec;
                std::vector<unsigned> charList;

                // Construct a list of all the characters represented by the pgroupSet...
                for (size_t i = 0u; i < pgroupSet->size(); i += 2u)
                    for (unsigned j = (*pgroupSet)[i]; j <= (*pgroupSet)[i + 1u]; ++j)
                        charList.push_back(j);

                // Delete std::vector
                parse[1].Destroy();

                // ...and then make the NFA
                parse[0].pNFA     = new NFA{charList, LexemeID};
                parse[0].DataType = RegExprNFAParseElement::RegExprDataType::NFA;
                break;
            }

                // C --> '[' '^' GroupSet ']'
            case RE_CNotGroupSet: {
                // Make a NFA out of the sequence
                const auto            pgroupSet = parse[2].pVec;
                std::vector<unsigned> charList;

                // Construct a list of all the characters NOT represented by the pgroupSet...
                // NOTE: Depends on 0..255 ASCII
                for (unsigned k = 1u; k <= 255u; ++k) {
                    bool f = false;
                    for (size_t i = 0u; i < pgroupSet->size(); i += 2u)
                        for (unsigned j = (*pgroupSet)[i]; j <= (*pgroupSet)[i + 1u]; ++j)
                            if (j == k)
                                f = true;

                    if (!f)
                        charList.push_back(k);
                }
                // Delete std::vector
                parse[2].Destroy();

                // ...and then make the NFA
                parse[0].pNFA     = new NFA{charList, LexemeID};
                parse[0].DataType = RegExprNFAParseElement::RegExprDataType::NFA;
                break;
            }

                // C --> '{' CharSet '}'
            case RE_CCharSet: {
                // Generate a string from the char std::vector
                SG_ASSERT(parse[1].pVec);
                String macroName;
                macroName.reserve(parse[1].pVec->size());
                for (auto const& ord : *parse[1].pVec) {
                    macroName.push_back(char(ord));
                }

                // Delete the character std::vector
                parse[1].Destroy();

                // Try to find it in macro list
                SG_ASSERT(pMacroNFAs != nullptr);
                auto const& map = *pMacroNFAs;
                auto const& iter = map.find(macroName);
                if (iter == map.end()) {
                    std::string names;
                    for (auto const& [name, _] : map)
                        names += " '" + name + '\'';
                    pLex->CheckForErrorAndReport("Macro '%s' not defined; there are %zu known macros:%s",
                                                 macroName.data(), map.size(), names.data());
                    // Bad!
                    return false;
                }

                // Get the NFA from the Macros list
                const auto pnfa = iter->second;

                if (!pnfa) {
                    pLex->CheckForErrorAndReport("Invalid regular expression in macro '%s' used",
                                                 macroName.data());
                    // Bad!
                    return false;
                }

                parse[0].pNFA     = new NFA{*pnfa, LexemeID};
                parse[0].DataType = RegExprNFAParseElement::RegExprDataType::NFA;
                break;
            }

            // GroupSet --> character
            case RE_GroupSetChar: {
                // Start off a new std::vector of char pairs
                const auto code   = parse[0].ch;

                parse[0].pVec     = new std::vector<unsigned>;
                parse[0].DataType = RegExprNFAParseElement::RegExprDataType::Vector;
                parse[0].pVec->push_back(code);
                parse[0].pVec->push_back(code);
                break;
            }

                // GroupSet --> character GroupSet
            case RE_GroupSetCharGroupSet:
                // Add the char to the end of the CharSet std::vector
                parse[1].pVec->push_back(parse[0].ch);
                parse[1].pVec->push_back(parse[0].ch);
                parse[0].pVec     = parse[1].pVec;
                parse[0].DataType = parse[1].DataType;
                break;

                // GroupSet --> character '-' character
            case RE_GroupSetCharList: {
                // Start off a new std::vector of char pairs
                const auto code   = parse[0].ch;
                const auto code2  = parse[2].ch;

                parse[0].pVec     = new std::vector<unsigned>;
                parse[0].DataType = RegExprNFAParseElement::RegExprDataType::Vector;
                parse[0].pVec->push_back(code);
                parse[0].pVec->push_back(code2);
                break;
            }

                // GroupSet --> character '-' character GroupSet
            case RE_GroupSetCharListGroupSet: {
                // Add the char to the end of the CharSet std::vector
                const auto code   = parse[0].ch;
                const auto code2  = parse[2].ch;

                parse[3].pVec->push_back(code);
                parse[3].pVec->push_back(code2);
                parse[0].pVec     = parse[3].pVec;
                parse[0].DataType = parse[3].DataType;
                break;
            }

                // CharSet --> character
            case RE_CharSet: {
                // Get the code and add it to the new std::vector
                const auto code   = parse[0].ch;
                // Create a new std::vector of chars
                parse[0].pVec     = new std::vector<unsigned>;
                parse[0].DataType = RegExprNFAParseElement::RegExprDataType::Vector;
                parse[0].pVec->push_back(code);
                break;
            }

                // CharSet --> CharSet character
            case RE_CharSetChar:
                // Add the char to the end of the CharSet std::vector
                parse[0].pVec->push_back(parse[1].ch);
                break;

            default:
                parse[0].pNFA     = nullptr;
                parse[0].DataType = RegExprNFAParseElement::RegExprDataType::Null;
                break;
        }

        return true;
    }